

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast.cpp
# Opt level: O3

bool duckdb::DecimalDecimalCastSwitch<duckdb::hugeint_t,duckdb::Hugeint>
               (Vector *source,Vector *result,idx_t count,CastParameters *parameters)

{
  PhysicalType PVar1;
  byte bVar2;
  byte bVar3;
  bool bVar4;
  NotImplementedException *pNVar5;
  string local_50;
  
  bVar2 = DecimalType::GetScale(&source->type);
  bVar3 = DecimalType::GetScale(&result->type);
  LogicalType::Verify(&source->type);
  LogicalType::Verify(&result->type);
  PVar1 = (result->type).physical_type_;
  if (bVar2 <= bVar3) {
    if (PVar1 < INT64) {
      if (PVar1 == INT16) {
        bVar4 = TemplatedDecimalScaleUp<duckdb::hugeint_t,short,duckdb::Hugeint,duckdb::NumericHelper>
                          (source,result,count,parameters);
        return bVar4;
      }
      if (PVar1 == INT32) {
        bVar4 = TemplatedDecimalScaleUp<duckdb::hugeint_t,int,duckdb::Hugeint,duckdb::NumericHelper>
                          (source,result,count,parameters);
        return bVar4;
      }
    }
    else {
      if (PVar1 == INT64) {
        bVar4 = TemplatedDecimalScaleUp<duckdb::hugeint_t,long,duckdb::Hugeint,duckdb::NumericHelper>
                          (source,result,count,parameters);
        return bVar4;
      }
      if (PVar1 == INT128) {
        bVar4 = TemplatedDecimalScaleUp<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::Hugeint,duckdb::Hugeint>
                          (source,result,count,parameters);
        return bVar4;
      }
    }
    pNVar5 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"Unimplemented internal type for decimal","");
    NotImplementedException::NotImplementedException(pNVar5,&local_50);
    __cxa_throw(pNVar5,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (PVar1 < INT64) {
    if (PVar1 == INT16) {
      bVar4 = TemplatedDecimalScaleDown<duckdb::hugeint_t,short,duckdb::Hugeint>
                        (source,result,count,parameters);
      return bVar4;
    }
    if (PVar1 == INT32) {
      bVar4 = TemplatedDecimalScaleDown<duckdb::hugeint_t,int,duckdb::Hugeint>
                        (source,result,count,parameters);
      return bVar4;
    }
  }
  else {
    if (PVar1 == INT64) {
      bVar4 = TemplatedDecimalScaleDown<duckdb::hugeint_t,long,duckdb::Hugeint>
                        (source,result,count,parameters);
      return bVar4;
    }
    if (PVar1 == INT128) {
      bVar4 = TemplatedDecimalScaleDown<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::Hugeint>
                        (source,result,count,parameters);
      return bVar4;
    }
  }
  pNVar5 = (NotImplementedException *)__cxa_allocate_exception(0x10);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"Unimplemented internal type for decimal","");
  NotImplementedException::NotImplementedException(pNVar5,&local_50);
  __cxa_throw(pNVar5,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static bool DecimalDecimalCastSwitch(Vector &source, Vector &result, idx_t count, CastParameters &parameters) {
	auto source_scale = DecimalType::GetScale(source.GetType());
	auto result_scale = DecimalType::GetScale(result.GetType());
	source.GetType().Verify();
	result.GetType().Verify();

	// we need to either multiply or divide by the difference in scales
	if (result_scale >= source_scale) {
		// multiply
		switch (result.GetType().InternalType()) {
		case PhysicalType::INT16:
			return TemplatedDecimalScaleUp<SOURCE, int16_t, POWERS_SOURCE, NumericHelper>(source, result, count,
			                                                                              parameters);
		case PhysicalType::INT32:
			return TemplatedDecimalScaleUp<SOURCE, int32_t, POWERS_SOURCE, NumericHelper>(source, result, count,
			                                                                              parameters);
		case PhysicalType::INT64:
			return TemplatedDecimalScaleUp<SOURCE, int64_t, POWERS_SOURCE, NumericHelper>(source, result, count,
			                                                                              parameters);
		case PhysicalType::INT128:
			return TemplatedDecimalScaleUp<SOURCE, hugeint_t, POWERS_SOURCE, Hugeint>(source, result, count,
			                                                                          parameters);
		default:
			throw NotImplementedException("Unimplemented internal type for decimal");
		}
	} else {
		// divide
		switch (result.GetType().InternalType()) {
		case PhysicalType::INT16:
			return TemplatedDecimalScaleDown<SOURCE, int16_t, POWERS_SOURCE>(source, result, count, parameters);
		case PhysicalType::INT32:
			return TemplatedDecimalScaleDown<SOURCE, int32_t, POWERS_SOURCE>(source, result, count, parameters);
		case PhysicalType::INT64:
			return TemplatedDecimalScaleDown<SOURCE, int64_t, POWERS_SOURCE>(source, result, count, parameters);
		case PhysicalType::INT128:
			return TemplatedDecimalScaleDown<SOURCE, hugeint_t, POWERS_SOURCE>(source, result, count, parameters);
		default:
			throw NotImplementedException("Unimplemented internal type for decimal");
		}
	}
}